

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O3

void __thiscall
TApp_IncorrectConstructionDuplicateExcludesTxt_Test::TestBody
          (TApp_IncorrectConstructionDuplicateExcludesTxt_Test *this)

{
  bool bVar1;
  Option *this_00;
  App *this_01;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  AssertHelper local_e8;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"--cat","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  this_01 = &(this->super_TApp).app;
  this_00 = CLI::App::add_flag(this_01,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"--other","");
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  CLI::App::add_flag(this_01,&local_80,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"--other","");
      CLI::Option::excludes<CLI::App>(this_00,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
    }
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"--other","");
      CLI::Option::excludes<CLI::App>(this_00,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
    }
    testing::Message::Message((Message *)&local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xc9,
               "Expected: cat->excludes(\"--other\") throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
              );
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_f0.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    bVar1 = testing::internal::IsTrue(true);
  }
  else {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,200,
               "Expected: cat->excludes(\"--other\") doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_f0.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    bVar1 = testing::internal::IsTrue(true);
  }
  if ((bVar1 != false) &&
     (local_f0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_f0.ptr_ + 8))();
  }
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionDuplicateExcludesTxt) {
    auto cat = app.add_flag("--cat");
    app.add_flag("--other");
    ASSERT_NO_THROW(cat->excludes("--other"));
    EXPECT_THROW(cat->excludes("--other"), CLI::OptionAlreadyAdded);
}